

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

bool_t tmDate(size_t *y,size_t *m,size_t *d)

{
  time_t tVar1;
  tm *ptVar2;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  time_t et;
  tm lt;
  time_t local_60;
  tm local_58;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  tVar1 = time(&local_60);
  if ((tVar1 != -1) && (ptVar2 = localtime_r(&local_60,&local_58), ptVar2 != (tm *)0x0)) {
    if (local_10 != (long *)0x0) {
      *local_10 = (long)local_58.tm_year;
      *local_10 = *local_10 + 0x76c;
    }
    if (local_18 != (long *)0x0) {
      *local_18 = (long)local_58.tm_mon + 1;
    }
    if (local_20 != (long *)0x0) {
      *local_20 = (long)local_58.tm_mday;
    }
    return 1;
  }
  return 0;
}

Assistant:

bool_t tmDate(size_t* y, size_t* m, size_t* d)
{
	struct tm lt;
	time_t et;
	// входной контроль
	ASSERT(memIsNullOrValid(y, O_PER_S));
	ASSERT(memIsNullOrValid(m, O_PER_S));
	ASSERT(memIsNullOrValid(d, O_PER_S));
	// получить отметку времени
	if (time(&et) == -1 || !localtime_r(&et, &lt))
		return FALSE;
	// возвратить данные
	if (y)
		*y = (size_t)lt.tm_year, *y += 1900;
	if (m)
		*m = (size_t)lt.tm_mon + 1;
	if (d)
		*d = (size_t)lt.tm_mday;
	return TRUE;
}